

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_brodnik.h
# Opt level: O0

void __thiscall vector_brodnik<int>::grow(vector_brodnik<int> *this)

{
  int *piVar1;
  vector_brodnik<int> *this_local;
  
  if (this->_left_in_block == 0) {
    if (this->_left_in_superblock == 0) {
      if ((this->_superblock & 1) == 0) {
        this->_block_size = this->_block_size << 1;
      }
      else {
        this->_superblock_size = this->_superblock_size << 1;
      }
      this->_superblock = this->_superblock + '\x01';
      this->_left_in_superblock = this->_superblock_size;
    }
    piVar1 = (int *)malloc(this->_block_size << 2);
    this->_insertpos = piVar1;
    std::vector<int_*,_std::allocator<int_*>_>::push_back(&this->_index_block,&this->_insertpos);
    this->_left_in_block = this->_block_size;
    this->_left_in_superblock = this->_left_in_superblock - 1;
    return;
  }
  __assert_fail("_left_in_block == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/../src/vector_brodnik.h"
                ,0x56,"void vector_brodnik<int>::grow() [T = int]");
}

Assistant:

void grow()
	{
		assert(_left_in_block == 0);
		if (_left_in_superblock == 0) {
			if (_superblock&1) { _superblock_size *= 2; }
			else               { _block_size *= 2;      }
			++_superblock;
			_left_in_superblock = _superblock_size;
		}
		_insertpos = static_cast<T*>(malloc(_block_size*sizeof(T)));
		_index_block.push_back(_insertpos);
		_left_in_block = _block_size;
		--_left_in_superblock;
	}